

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O2

void ftr2e_(float *A1,int *A2,char *A3,int *A4,size_t C3)

{
  float fval;
  int decim;
  char *s;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char str [21];
  
  fval = *A1;
  decim = *A2;
  sVar2 = gMinStrLen;
  if (gMinStrLen <= C3) {
    sVar2 = C3;
  }
  s = (char *)malloc(sVar2 + 1);
  s[C3] = '\0';
  pcVar3 = A3;
  memcpy(s,A3,C3);
  kill_trailing(s,(char)pcVar3);
  ffr2e(fval,decim,s,A4);
  snprintf(str,0x15,"%20s",s);
  strcpy(s,str);
  sVar1 = strlen(s);
  sVar2 = C3;
  if (sVar1 < C3) {
    sVar2 = sVar1;
  }
  memcpy(A3,s,sVar2);
  if (sVar1 <= C3 && C3 - sVar1 != 0) {
    memset(A3 + sVar1,0x20,C3 - sVar1);
  }
  free(s);
  return;
}

Assistant:

CFextern VOID_cfF(FTR2E,ftr2e)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FLOAT,INT,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FLOAT,1)
   QCF(INT,2)
   QCF(PSTRING,3)
   QCF(PINT,4)
   char str[21];

   ffr2e( TCF(ftr2e,FLOAT,1,0) 
          TCF(ftr2e,INT,2,1) 
          TCF(ftr2e,PSTRING,3,1) 
          TCF(ftr2e,PINT,4,1) );

   snprintf(str,21,"%20s",B3);
   strcpy(B3,str);

   RCF(FLOAT,1)
   RCF(INT,2)
   RCF(PSTRING,3)
   RCF(PINT,4)
}